

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Counts * __thiscall Catch::Counts::operator-(Counts *this,Counts *other)

{
  uint64_t uVar1;
  uint64_t uVar2;
  Counts *in_RDI;
  
  in_RDI->failedButOk = 0;
  in_RDI->skipped = 0;
  in_RDI->passed = 0;
  in_RDI->failed = 0;
  uVar1 = this->failed;
  uVar2 = other->failed;
  in_RDI->passed = this->passed - other->passed;
  in_RDI->failed = uVar1 - uVar2;
  uVar1 = this->skipped;
  uVar2 = other->skipped;
  in_RDI->failedButOk = this->failedButOk - other->failedButOk;
  in_RDI->skipped = uVar1 - uVar2;
  return in_RDI;
}

Assistant:

Counts Counts::operator - ( Counts const& other ) const {
        Counts diff;
        diff.passed = passed - other.passed;
        diff.failed = failed - other.failed;
        diff.failedButOk = failedButOk - other.failedButOk;
        diff.skipped = skipped - other.skipped;
        return diff;
    }